

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface_tests.cpp
# Opt level: O0

void __thiscall
validationinterface_tests::unregister_all_during_call::test_method(unregister_all_during_call *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  shared_ptr<validationinterface_tests::TestInterface> shared;
  bool destroyed;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  lazy_ostream *in_stack_fffffffffffffd58;
  const_string *in_stack_fffffffffffffd60;
  const_string *file;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  const_string local_228 [2];
  lazy_ostream local_208 [2];
  assertion_result local_1e8;
  lazy_ostream local_190 [2];
  assertion_result local_170 [2];
  const_string local_138 [2];
  lazy_ostream local_118 [2];
  assertion_result local_f8 [2];
  const_string local_c0 [2];
  lazy_ostream local_a0 [2];
  assertion_result local_80 [3];
  undefined1 *local_38;
  undefined1 *local_28;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_9 = 0;
  std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator*
            ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
  local_38 = &local_9;
  local_28 = local_38;
  std::
  make_shared<validationinterface_tests::TestInterface,ValidationSignals&,validationinterface_tests::unregister_all_during_call::test_method()::__0,validationinterface_tests::unregister_all_during_call::test_method()::__1>
            ((ValidationSignals *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
             (anon_class_16_2_dbd72a86 *)in_stack_fffffffffffffd60,
             (anon_class_8_1_8c041cb9 *)in_stack_fffffffffffffd58);
  std::unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_>::operator->
            ((unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *)
             in_stack_fffffffffffffd28);
  std::shared_ptr<CValidationInterface>::shared_ptr<validationinterface_tests::TestInterface,void>
            ((shared_ptr<CValidationInterface> *)in_stack_fffffffffffffd28,
             (shared_ptr<validationinterface_tests::TestInterface> *)0xd0b036);
  ValidationSignals::RegisterSharedValidationInterface
            ((ValidationSignals *)in_stack_fffffffffffffd58,
             (shared_ptr<CValidationInterface> *)
             CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
  std::shared_ptr<CValidationInterface>::~shared_ptr
            ((shared_ptr<CValidationInterface> *)in_stack_fffffffffffffd28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (pointer)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (unsigned_long)in_stack_fffffffffffffd28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
               in_stack_fffffffffffffd60,(size_t)in_stack_fffffffffffffd58,
               (const_string *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
    std::__shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>::
    use_count((__shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2> *)
              in_stack_fffffffffffffd28);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (bool)in_stack_fffffffffffffd37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (pointer)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (unsigned_long)in_stack_fffffffffffffd28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (pointer)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (unsigned_long)in_stack_fffffffffffffd28);
    in_stack_fffffffffffffd28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_80,local_a0,local_c0,0x60,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  __shared_ptr_access<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)in_stack_fffffffffffffd28);
  TestInterface::Call((TestInterface *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50)
                     );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (pointer)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (unsigned_long)in_stack_fffffffffffffd28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
               in_stack_fffffffffffffd60,(size_t)in_stack_fffffffffffffd58,
               (const_string *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
    std::__shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>::
    use_count((__shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2> *)
              in_stack_fffffffffffffd28);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (bool)in_stack_fffffffffffffd37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (pointer)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (unsigned_long)in_stack_fffffffffffffd28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (pointer)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (unsigned_long)in_stack_fffffffffffffd28);
    in_stack_fffffffffffffd28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f8,local_118,local_138,0x62,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd28);
    in_stack_fffffffffffffd6f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffd6f);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (pointer)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (unsigned_long)in_stack_fffffffffffffd28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),file
               ,(size_t)in_stack_fffffffffffffd58,
               (const_string *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (bool)in_stack_fffffffffffffd37);
    in_stack_fffffffffffffd58 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (pointer)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (unsigned_long)in_stack_fffffffffffffd28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (pointer)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (unsigned_long)in_stack_fffffffffffffd28);
    in_stack_fffffffffffffd28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_170,local_190,(const_string *)&stack0xfffffffffffffe50,99,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd28);
    in_stack_fffffffffffffd57 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffd57);
  std::__shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<validationinterface_tests::TestInterface,_(__gnu_cxx::_Lock_policy)2> *)
             CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (pointer)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (unsigned_long)in_stack_fffffffffffffd28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),file
               ,(size_t)in_stack_fffffffffffffd58,
               (const_string *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (bool)in_stack_fffffffffffffd37);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (pointer)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (unsigned_long)in_stack_fffffffffffffd28);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
               (pointer)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               (unsigned_long)in_stack_fffffffffffffd28);
    in_stack_fffffffffffffd28 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_1e8,local_208,local_228,0x65,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd28);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd28);
    in_stack_fffffffffffffd3f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffd3f);
  std::shared_ptr<validationinterface_tests::TestInterface>::~shared_ptr
            ((shared_ptr<validationinterface_tests::TestInterface> *)in_stack_fffffffffffffd28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(unregister_all_during_call)
{
    bool destroyed = false;
    auto shared{std::make_shared<TestInterface>(
        *m_node.validation_signals,
        [&] {
            // First call should decrements reference count 2 -> 1
            m_node.validation_signals->UnregisterAllValidationInterfaces();
            BOOST_CHECK(!destroyed);
            // Second call should not decrement reference count 1 -> 0
            m_node.validation_signals->UnregisterAllValidationInterfaces();
            BOOST_CHECK(!destroyed);
        },
        [&] { destroyed = true; })};
    m_node.validation_signals->RegisterSharedValidationInterface(shared);
    BOOST_CHECK(shared.use_count() == 2);
    shared->Call();
    BOOST_CHECK(shared.use_count() == 1);
    BOOST_CHECK(!destroyed);
    shared.reset();
    BOOST_CHECK(destroyed);
}